

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O2

void __thiscall
QGraphicsProxyWidgetPrivate::sendWidgetMouseEvent
          (QGraphicsProxyWidgetPrivate *this,QGraphicsSceneHoverEvent *event)

{
  KeyboardModifiers modifiers;
  quint64 ts;
  long in_FS_OFFSET;
  QPointF QVar1;
  QPointF local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent
            ((QGraphicsSceneMouseEvent *)&local_48,GraphicsSceneMouseMove);
  QVar1 = QGraphicsSceneHoverEvent::pos(event);
  local_58.yp = QVar1.yp;
  local_58.xp = QVar1.xp;
  QGraphicsSceneMouseEvent::setPos((QGraphicsSceneMouseEvent *)&local_48,&local_58);
  local_58.xp = (qreal)QGraphicsSceneHoverEvent::screenPos(event);
  QGraphicsSceneMouseEvent::setScreenPos((QGraphicsSceneMouseEvent *)&local_48,(QPoint *)&local_58);
  QGraphicsSceneMouseEvent::setButton((QGraphicsSceneMouseEvent *)&local_48,NoButton);
  QGraphicsSceneMouseEvent::setButtons((QGraphicsSceneMouseEvent *)&local_48,(MouseButtons)0x0);
  modifiers = QGraphicsSceneHoverEvent::modifiers(event);
  QGraphicsSceneMouseEvent::setModifiers((QGraphicsSceneMouseEvent *)&local_48,modifiers);
  ts = QGraphicsSceneEvent::timestamp(&event->super_QGraphicsSceneEvent);
  QGraphicsSceneEvent::setTimestamp((QGraphicsSceneEvent *)&local_48,ts);
  sendWidgetMouseEvent(this,(QGraphicsSceneMouseEvent *)&local_48);
  (**(code **)(*(long *)&event->super_QGraphicsSceneEvent + 0x10))(event,puStack_40._4_1_);
  QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidgetPrivate::sendWidgetMouseEvent(QGraphicsSceneHoverEvent *event)
{
    QGraphicsSceneMouseEvent mouseEvent(QEvent::GraphicsSceneMouseMove);
    mouseEvent.setPos(event->pos());
    mouseEvent.setScreenPos(event->screenPos());
    mouseEvent.setButton(Qt::NoButton);
    mouseEvent.setButtons({ });
    mouseEvent.setModifiers(event->modifiers());
    mouseEvent.setTimestamp(event->timestamp());
    sendWidgetMouseEvent(&mouseEvent);
    event->setAccepted(mouseEvent.isAccepted());
}